

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O2

string * OB::Term::ANSI_Escape_Codes::fg_256(string *__return_storage_ptr__,string *str_)

{
  uint uVar1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  
  uVar1 = std::__cxx11::stoi(str_,(size_t *)0x0,10);
  if (uVar1 < 0x101) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,(string *)esc_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"[38;5;");
    poVar2 = std::operator<<(poVar2,(string *)str_);
    std::operator<<(poVar2,"m");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string fg_256(std::string const& str_)
{
  auto const n = std::stoi(str_);
  if (n < 0 || n > 256) return {};
  std::stringstream ss;
  ss << esc << "[38;5;" << str_ << "m";

  return ss.str();
}